

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O0

Type __thiscall wasm::ParamInfo::getValueType(ParamInfo *this,Module *module)

{
  SmallVector<wasm::Literal,_1UL> *this_00;
  Literal *pLVar1;
  add_pointer_t<const_std::vector<wasm::Name>_> this_01;
  const_reference pvVar2;
  Function *pFVar3;
  Function *callee;
  add_pointer_t<const_std::vector<wasm::Name>_> callees;
  add_pointer_t<const_wasm::Literals> literals;
  Module *module_local;
  ParamInfo *this_local;
  
  this_00 = &std::
             get_if<wasm::Literals,wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>
                       (&this->values)->super_SmallVector<wasm::Literal,_1UL>;
  if (this_00 == (SmallVector<wasm::Literal,_1UL> *)0x0) {
    this_01 = std::
              get_if<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>
                        (&this->values);
    if (this_01 == (add_pointer_t<const_std::vector<wasm::Name>_>)0x0) {
      handle_unreachable("unexpected const value type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                         ,0x7b);
    }
    pvVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[](this_01,0);
    pFVar3 = Module::getFunction(module,(Name)(pvVar2->super_IString).str);
    wasm::Type::Type((Type *)&this_local,(HeapType)(pFVar3->type).id,NonNullable);
  }
  else {
    pLVar1 = SmallVector<wasm::Literal,_1UL>::operator[](this_00,0);
    this_local = (ParamInfo *)(pLVar1->type).id;
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type getValueType(Module* module) const {
    if (const auto literals = std::get_if<Literals>(&values)) {
      return (*literals)[0].type;
    } else if (auto callees = std::get_if<std::vector<Name>>(&values)) {
      auto* callee = module->getFunction((*callees)[0]);
      return Type(callee->type, NonNullable);
    } else {
      WASM_UNREACHABLE("unexpected const value type");
    }
  }